

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O3

void length_encoder_reset(lzma_length_encoder *lencoder,uint32_t num_pos_states,_Bool fast_mode)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  
  lencoder->choice = 0x400;
  lencoder->choice2 = 0x400;
  if (num_pos_states != 0) {
    lVar2 = 0;
    do {
      puVar1 = (undefined8 *)((long)lencoder->low[0] + lVar2);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      puVar1 = (undefined8 *)((long)lencoder->mid[0] + lVar2);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)num_pos_states << 4 != lVar2);
  }
  lVar2 = 0x102;
  do {
    puVar1 = (undefined8 *)((long)(lencoder->low + -1) + 0xc + lVar2 * 2);
    *puVar1 = 0x400040004000400;
    puVar1[1] = 0x400040004000400;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x202);
  if (num_pos_states != 0 && !fast_mode) {
    uVar3 = 0;
    do {
      length_update_prices(lencoder,(uint32_t)uVar3);
      uVar3 = uVar3 + 1;
    } while (num_pos_states != uVar3);
  }
  return;
}

Assistant:

static void
length_encoder_reset(lzma_length_encoder *lencoder,
		const uint32_t num_pos_states, const bool fast_mode)
{
	size_t pos_state;

	bit_reset(lencoder->choice);
	bit_reset(lencoder->choice2);

	for (pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(lencoder->low[pos_state], LEN_LOW_BITS);
		bittree_reset(lencoder->mid[pos_state], LEN_MID_BITS);
	}

	bittree_reset(lencoder->high, LEN_HIGH_BITS);

	if (!fast_mode)
		for (pos_state = 0; pos_state < num_pos_states;
				++pos_state)
			length_update_prices(lencoder, pos_state);

	return;
}